

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int INT_CMConnection_set_character(CMConnection conn,attr_list attrs)

{
  int iVar1;
  __pid_t _Var2;
  long lVar3;
  pthread_t pVar4;
  attr_list p_Var5;
  long in_RSI;
  long *in_RDI;
  timespec ts_2;
  timespec ts_1;
  CMTaskHandle prior_task;
  timespec ts;
  CMTaskHandle task;
  int previous_interval;
  bw_measure_data data;
  ssize_t interval_value;
  FILE *in_stack_ffffffffffffff60;
  CMPollFunc in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  FILE *__stream;
  CManager_conflict in_stack_ffffffffffffff78;
  FILE *in_stack_ffffffffffffff80;
  attr_list in_stack_ffffffffffffff88;
  CManager in_stack_ffffffffffffff90;
  undefined4 local_68;
  CMTraceType in_stack_ffffffffffffff9c;
  CManager in_stack_ffffffffffffffa0;
  long local_58;
  long local_50;
  timespec local_48;
  CMTaskHandle local_38;
  uint local_2c;
  int *local_28;
  ulong local_20;
  long local_18;
  long *local_10;
  int local_4;
  
  if (in_RSI == 0) {
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar1 = get_long_attr(in_RSI,CM_BW_MEASURE_INTERVAL,&local_20);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_38 = (CMTaskHandle)0x0;
      if (((long)local_20 < 2) || (0x7080 < (long)local_20)) {
        printf("Bad CM_BW_MEASURE_INTERVAL, %zd seconds\n",local_20);
        local_4 = 0;
      }
      else {
        iVar1 = CMtrace_val[3];
        if (*(long *)(*local_10 + 0x120) == 0) {
          iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            in_stack_ffffffffffffff80 = *(FILE **)(*local_10 + 0x120);
            _Var2 = getpid();
            in_stack_ffffffffffffff88 = (attr_list)(long)_Var2;
            pVar4 = pthread_self();
            fprintf(in_stack_ffffffffffffff80,"P%lxT%lx - ",in_stack_ffffffffffffff88,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_48);
            fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
          }
          fprintf(*(FILE **)(*local_10 + 0x120),"CM_BW_MEASURE_INTERVAL set, interval is %zd\n",
                  local_20);
        }
        fflush(*(FILE **)(*local_10 + 0x120));
        if ((local_10[0x13] != 0) &&
           (iVar1 = get_int_attr(local_10[0x13],CM_BW_MEASURE_INTERVAL,&local_2c), iVar1 != 0)) {
          local_50 = 0;
          if ((long)(int)local_2c <= (long)local_20) {
            iVar1 = CMtrace_val[3];
            if (*(long *)(*local_10 + 0x120) == 0) {
              iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
            }
            if (iVar1 != 0) {
              if (CMtrace_PID != 0) {
                __stream = *(FILE **)(*local_10 + 0x120);
                _Var2 = getpid();
                lVar3 = (long)_Var2;
                pVar4 = pthread_self();
                fprintf(__stream,"P%lxT%lx - ",lVar3,pVar4);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,(timespec *)&stack0xffffffffffffffa0);
                fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffffa0,
                        local_58);
              }
              fprintf(*(FILE **)(*local_10 + 0x120),
                      "CM_BW_MEASURE_INTERVAL prior interval is %d, no action.\n",(ulong)local_2c);
            }
            fflush(*(FILE **)(*local_10 + 0x120));
            return 1;
          }
          iVar1 = CMtrace_val[3];
          if (*(long *)(*local_10 + 0x120) == 0) {
            iVar1 = CMtrace_init(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          }
          if (iVar1 != 0) {
            if (CMtrace_PID != 0) {
              in_stack_ffffffffffffff60 = *(FILE **)(*local_10 + 0x120);
              _Var2 = getpid();
              in_stack_ffffffffffffff68 = (CMPollFunc)(long)_Var2;
              pVar4 = pthread_self();
              fprintf(in_stack_ffffffffffffff60,"P%lxT%lx - ",in_stack_ffffffffffffff68,pVar4);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&stack0xffffffffffffff90);
              fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffff90,
                      CONCAT44(in_stack_ffffffffffffff9c,local_68));
            }
            fprintf(*(FILE **)(*local_10 + 0x120),
                    "CM_BW_MEASURE_INTERVAL prior interval is %d, killing prior task.\n",
                    (ulong)local_2c);
          }
          fflush(*(FILE **)(*local_10 + 0x120));
          get_long_attr(local_10[0x13],CM_BW_MEASURE_TASK,&local_50);
          if (local_50 != 0) {
            INT_CMremove_task((CMTaskHandle)in_stack_ffffffffffffff60);
            set_long_attr(local_10[0x13],CM_BW_MEASURE_TASK,0);
          }
        }
        local_28 = (int *)INT_CMmalloc((size_t)in_stack_ffffffffffffff60);
        local_28[1] = -1;
        *local_28 = -1;
        get_int_attr(local_18,CM_BW_MEASURE_SIZE,local_28);
        if (*local_28 < 0x400) {
          *local_28 = 0x400;
        }
        get_int_attr(local_18,CM_BW_MEASURE_SIZEINC,local_28 + 1);
        if (local_28[1] < 0x400) {
          local_28[1] = 0x400;
        }
        local_28[2] = 0;
        local_28[3] = 0;
        *(long **)(local_28 + 4) = local_10;
        p_Var5 = CMint_attr_copy_list
                           (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                            (char *)in_stack_ffffffffffffff80,
                            (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        iVar1 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
        *(attr_list *)(local_28 + 6) = p_Var5;
        local_38 = INT_CMadd_delayed_task
                             (in_stack_ffffffffffffff78,
                              (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                              (int)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                              in_stack_ffffffffffffff60);
        free(local_38);
        local_38 = INT_CMadd_periodic_task
                             (in_stack_ffffffffffffff78,
                              (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                              (int)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                              in_stack_ffffffffffffff60);
        if (local_10[0x13] == 0) {
          p_Var5 = CMint_create_attr_list
                             (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,iVar1);
          local_10[0x13] = (long)p_Var5;
        }
        set_int_attr(local_10[0x13],CM_BW_MEASURE_INTERVAL,local_20 & 0xffffffff);
        set_long_attr(local_10[0x13],CM_BW_MEASURE_TASK,local_38);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

extern int
 INT_CMConnection_set_character(CMConnection conn, attr_list attrs)
 {
     ssize_t interval_value;
     if (attrs == NULL) return 0;
     if (get_long_attr(attrs, CM_BW_MEASURE_INTERVAL, &interval_value)) {
	 bw_measure_data data;
	 int previous_interval;
	 CMTaskHandle task = NULL;
	 if ((interval_value <= 1) || (interval_value > 60*60*8)) {
	     printf("Bad CM_BW_MEASURE_INTERVAL, %zd seconds\n",
		    interval_value);
	     return 0;
	 }

	 CMtrace_out(conn->cm, CMLowLevelVerbose,"CM_BW_MEASURE_INTERVAL set, interval is %zd\n", interval_value);
	 if (conn->characteristics && 
	     (get_int_attr(conn->characteristics, CM_BW_MEASURE_INTERVAL,
			   &previous_interval) != 0)) {
	     CMTaskHandle prior_task = NULL;
	     if (interval_value >= previous_interval) {
		 CMtrace_out(conn->cm, CMLowLevelVerbose,"CM_BW_MEASURE_INTERVAL prior interval is %d, no action.\n", previous_interval);
		 return 1;
	     }
	     CMtrace_out(conn->cm, CMLowLevelVerbose,"CM_BW_MEASURE_INTERVAL prior interval is %d, killing prior task.\n", previous_interval);
	     get_long_attr(conn->characteristics, CM_BW_MEASURE_TASK,
			   (ssize_t*)(intptr_t)&prior_task);
	     if (prior_task) {
		 INT_CMremove_task(prior_task);
		 set_long_attr(conn->characteristics, CM_BW_MEASURE_TASK, (intptr_t)0);
	     }
	 }
	 data = malloc(sizeof(*data));
	 data->size=data->size_inc=-1;

	 /*Get attr about size, size_inc from attributes. */
	 get_int_attr(attrs, CM_BW_MEASURE_SIZE, &(data->size));
	 if(data->size<1024)
	     data->size=1024;
	 get_int_attr(attrs, CM_BW_MEASURE_SIZEINC, &(data->size_inc));
	 if(data->size_inc<1024)
	     data->size_inc=1024;

	 data->successful_run=0;
	 data->failed_run=0;

	 /*app set attr about N and repeat time. store in data->attrs automically and pass to regressive_probe_bandwidth. 
	  */
	 data->conn = conn;
	 data->attrs = CMattr_copy_list(conn->cm, attrs);
	 /* do one task almost immediately */
	 task = INT_CMadd_delayed_task(conn->cm, 0, 1000, do_bw_measure, 
				   (void*)data);
	 free(task);
	 /* schedule tasks periodically */
	 task = INT_CMadd_periodic_task(conn->cm, (int)interval_value, 0, 
				    do_bw_measure, (void*)data);
	 if (conn->characteristics == NULL) {
	     conn->characteristics = CMcreate_attr_list(conn->cm);
	 }
	 set_int_attr(conn->characteristics, CM_BW_MEASURE_INTERVAL,
		      (int)interval_value);
	 set_long_attr(conn->characteristics, CM_BW_MEASURE_TASK, (intptr_t)task);

	 return 1;
     }
     return 0;
 }